

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O0

size_t prometheus::detail::WriteResponse(mg_connection *conn,string *body)

{
  bool bVar1;
  size_type sVar2;
  uchar *buf;
  undefined8 uVar3;
  void *buf_00;
  size_t sVar4;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed;
  bool acceptsGzip;
  string *body_local;
  mg_connection *conn_local;
  
  mg_printf(conn,"HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=utf-8\r\n");
  compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = IsEncodingAccepted(conn,"gzip");
  if ((bool)compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_) {
    GZipCompress((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,body);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    if (!bVar1) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      mg_printf(conn,"Content-Encoding: gzip\r\nContent-Length: %lu\r\n\r\n",sVar2);
      buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      mg_write(conn,buf,sVar2);
      conn_local = (mg_connection *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    if (!bVar1) {
      return (size_t)conn_local;
    }
  }
  uVar3 = std::__cxx11::string::size();
  mg_printf(conn,"Content-Length: %lu\r\n\r\n",uVar3);
  buf_00 = (void *)std::__cxx11::string::data();
  sVar4 = std::__cxx11::string::size();
  mg_write(conn,buf_00,sVar4);
  sVar4 = std::__cxx11::string::size();
  return sVar4;
}

Assistant:

static std::size_t WriteResponse(struct mg_connection* conn,
                                 const std::string& body) {
  mg_printf(conn,
            "HTTP/1.1 200 OK\r\n"
            "Content-Type: text/plain; charset=utf-8\r\n");

#ifdef HAVE_ZLIB
  auto acceptsGzip = IsEncodingAccepted(conn, "gzip");

  if (acceptsGzip) {
    auto compressed = GZipCompress(body);
    if (!compressed.empty()) {
      mg_printf(conn,
                "Content-Encoding: gzip\r\n"
                "Content-Length: %lu\r\n\r\n",
                static_cast<unsigned long>(compressed.size()));
      mg_write(conn, compressed.data(), compressed.size());
      return compressed.size();
    }
  }
#endif

  mg_printf(conn, "Content-Length: %lu\r\n\r\n",
            static_cast<unsigned long>(body.size()));
  mg_write(conn, body.data(), body.size());
  return body.size();
}